

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu382.c
# Opt level: O3

MPP_RET hal_vp9d_vdpu382_flush(void *hal)

{
  long lVar1;
  byte bVar2;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (((byte)hal_vp9d_debug & 1) == 0) {
    *(undefined8 *)(lVar1 + 0xf0) = 0xffffffffffffffff;
  }
  else {
    _mpp_log_l(4,"hal_vp9d_vdpu382","(%d) enter\n","hal_vp9d_vdpu382_flush",0x43c);
    bVar2 = (byte)hal_vp9d_debug & 1;
    *(undefined8 *)(lVar1 + 0xf0) = 0xffffffffffffffff;
    if (bVar2 != 0) {
      _mpp_log_l(4,"hal_vp9d_vdpu382","(%d) leave\n","hal_vp9d_vdpu382_flush",0x441);
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp9d_vdpu382_flush(void *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu382Vp9dCtx *hw_ctx = (Vdpu382Vp9dCtx*)p_hal->hw_ctx;

    hal_vp9d_enter();

    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;

    hal_vp9d_leave();

    return MPP_OK;
}